

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::GetType(VirtualMachine *this)

{
  element_type *peVar1;
  string *val;
  Variable VVar2;
  string local_48;
  allocator<char> local_21;
  
  VVar2 = popOpStack(this);
  val = Heap::NewString_abi_cxx11_(&this->heap);
  if (VVar2.type < (Function|Integer)) {
    std::__cxx11::string::assign((char *)val);
    pushString(this,val);
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Unknown varible type at variableEquals",&local_21);
  panic(this,&local_48);
}

Assistant:

void runtime::VirtualMachine::GetType() {
  Variable top = this->popOpStack();

  auto str = this->heap.NewString();

  switch (top.type) {
    case VariableType::Integer: {
      str->assign("integer");
      break;
    }
    case VariableType::Float: {
      str->assign("float");
      break;
    }
    case VariableType::Function: {
      str->assign("function");
      break;
    }
    case VariableType::Object: {
      str->assign("object");
      break;
    }
    case VariableType::String: {
      str->assign("string");
      break;
    }
    case VariableType::Undefined: {
      str->assign("undefined");
      break;
    }
    case VariableType::Boolean: {
      str->assign("boolean");
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->pushString(str);
  this->advance();
}